

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O2

void __thiscall http::Page::Process(Page *this,char *htmlFile,char *marker,MarkerContent content)

{
  ostream *poVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  int iVar4;
  int local_38;
  
  __stream = fopen(htmlFile,"r");
  if (__stream == (FILE *)0x0) {
    printf("failed to open file \'%s\'\n",htmlFile);
    return;
  }
  sVar3 = strlen(marker);
  poVar1 = &this->m_ostream;
LAB_00104f34:
  do {
    iVar4 = 0;
    do {
      while( true ) {
        iVar2 = fgetc(__stream);
        if (iVar2 < 1) {
          return;
        }
        if (iVar2 == marker[iVar4]) break;
        if (0 < iVar4) {
          std::ostream::write((char *)poVar1,(long)marker);
          goto LAB_00104f34;
        }
        std::operator<<(poVar1,(char)iVar2);
      }
      iVar4 = iVar4 + 1;
      local_38 = (int)sVar3;
    } while (iVar4 != local_38);
    std::operator<<(poVar1,"<!-- ");
    std::operator<<(poVar1,marker);
    std::operator<<(poVar1," start -->");
    (*content)(this);
    std::operator<<(poVar1,"<!-- ");
    std::operator<<(poVar1,marker);
    std::operator<<(poVar1," end -->");
  } while( true );
}

Assistant:

void http::Page::Process(const char* htmlFile, const char* marker, MarkerContent content)
{
    FILE* f = fopen(htmlFile, "r");
    if (f)
    {
        int c;
        int markerIndex = 0;
        int markerLength = strlen(marker);
        std::ostream& out = get_output_stream();
        while ((c = fgetc(f)) > 0)
        {
            if (c == marker[markerIndex])
            {
                markerIndex++;
                if (markerIndex == markerLength)
                {
                    // found the marker
                    markerIndex = 0;
                    out << "<!-- ";
                    out << marker;
                    out << " start -->";
                    content(this);
                    out << "<!-- ";
                    out << marker;
                    out << " end -->";
                }
            }
            else if (markerIndex > 0)
            {
                // Send the part of the marker that matched so far
                out.write(marker, markerIndex);
                markerIndex = 0;
            }
            else
            {
                char ch = c;
                out << ch;
            }
        }
    }
    else
    {
        printf("failed to open file '%s'\n", htmlFile);
    }
}